

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  pointer pcVar1;
  size_t __n;
  int iVar2;
  bool bVar3;
  string local_pname;
  long *local_130;
  long local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  long *local_110;
  long local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  size_type *local_f0;
  size_t local_e8;
  size_type local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0;
  undefined8 uStack_b8;
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if (name->_M_string_length < 3) {
    bVar3 = false;
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_50,(ulong)name);
    iVar2 = ::std::__cxx11::string::compare((char *)local_50);
    bVar3 = iVar2 == 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  if (bVar3) {
    ::std::__cxx11::string::substr((ulong)&local_90,(ulong)name);
    bVar3 = check_lname(this,&local_90);
    local_e0[0] = local_90.field_2._M_allocated_capacity;
    local_b0._M_dataplus._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return bVar3;
    }
  }
  else {
    if (name->_M_string_length < 2) {
      bVar3 = false;
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)name);
      iVar2 = ::std::__cxx11::string::compare((char *)local_70);
      bVar3 = iVar2 == 0;
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
    }
    if (bVar3) {
      ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)name);
      bVar3 = check_sname(this,&local_b0);
      local_e0[0] = local_b0.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
        return bVar3;
      }
    }
    else {
      pcVar1 = (this->pname_)._M_dataplus._M_p;
      local_f0 = local_e0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar1,pcVar1 + (this->pname_)._M_string_length);
      if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
        local_110 = (long *)&local_100;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_f0,(long)local_f0 + local_e8);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_110,(undefined1 *)(local_108 + (long)local_110),local_110);
        if (local_110 == (long *)&local_100) {
          uStack_b8 = uStack_f8;
          local_d0 = &local_c0;
        }
        else {
          local_d0 = local_110;
        }
        local_c0 = CONCAT71(uStack_ff,local_100);
        local_c8 = local_108;
        local_108 = 0;
        local_100 = 0;
        local_110 = (long *)&local_100;
        ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_d0);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_110 != (long *)&local_100) {
          operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
        }
        pcVar1 = (name->_M_dataplus)._M_p;
        local_130 = (long *)&local_120;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar1,pcVar1 + name->_M_string_length);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_130,(undefined1 *)(local_128 + (long)local_130),local_130);
        if (local_130 == (long *)&local_120) {
          uStack_b8 = uStack_118;
          local_d0 = &local_c0;
        }
        else {
          local_d0 = local_130;
        }
        local_c0 = CONCAT71(uStack_11f,local_120);
        local_c8 = local_128;
        local_128 = 0;
        local_120 = 0;
        local_130 = (long *)&local_120;
        ::std::__cxx11::string::operator=((string *)name,(string *)&local_d0);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_130 != (long *)&local_120) {
          operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
        }
      }
      __n = name->_M_string_length;
      if (__n == local_e8) {
        if (__n == 0) {
          bVar3 = true;
        }
        else {
          iVar2 = bcmp((name->_M_dataplus)._M_p,local_f0,__n);
          bVar3 = iVar2 == 0;
        }
      }
      else {
        bVar3 = false;
      }
      local_b0._M_dataplus._M_p = (pointer)local_f0;
      if (local_f0 == local_e0) {
        return bVar3;
      }
    }
  }
  operator_delete(local_b0._M_dataplus._M_p,local_e0[0] + 1);
  return bVar3;
}

Assistant:

bool check_name(std::string name) const {

        if(name.length() > 2 && name.substr(0, 2) == "--")
            return check_lname(name.substr(2));
        else if(name.length() > 1 && name.substr(0, 1) == "-")
            return check_sname(name.substr(1));
        else {
            std::string local_pname = pname_;
            if(ignore_case_) {
                local_pname = detail::to_lower(local_pname);
                name = detail::to_lower(name);
            }
            return name == local_pname;
        }
    }